

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_monitor_data.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2545c::Json2Array<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>::
Json2Array(Json2Array<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType> *this,Value *value,
          vector<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType,_std::allocator<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_e8 [8];
  CdnDescribeCdnMonitorDataCDNMonitorDataType val;
  int i;
  vector<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType,_std::allocator<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.average_object_size.field_2._12_4_ = 0; uVar1 = val.average_object_size.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.average_object_size.field_2._12_4_ = val.average_object_size.field_2._12_4_ + 1) {
      aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType::
      CdnDescribeCdnMonitorDataCDNMonitorDataType
                ((CdnDescribeCdnMonitorDataCDNMonitorDataType *)local_e8);
      value_00 = Json::Value::operator[](value,val.average_object_size.field_2._12_4_);
      anon_unknown.dwarf_2545c::Json2Type
                (value_00,(CdnDescribeCdnMonitorDataCDNMonitorDataType *)local_e8);
      std::
      vector<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType,_std::allocator<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>_>
      ::push_back(vec,(value_type *)local_e8);
      aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType::
      ~CdnDescribeCdnMonitorDataCDNMonitorDataType
                ((CdnDescribeCdnMonitorDataCDNMonitorDataType *)local_e8);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }